

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_Utf8ValidationTest_::
WriteValidUTF8String<proto2_unittest::TestAllTypes>::~WriteValidUTF8String
          (WriteValidUTF8String<proto2_unittest::TestAllTypes> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(Utf8ValidationTest, WriteValidUTF8String) {
  std::string wire_buffer;
  typename TestFixture::OneString input;
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(0);
    log.StartCapturingLogs();
    WriteMessage(this->kValidUTF8String, &input, &wire_buffer);
  }
}